

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.cc
# Opt level: O1

void __thiscall
gimage::ImageIO::load(ImageIO *this,ImageFloat *image,char *name,int ds,long x,long y,long w,long h)

{
  float ***pppfVar1;
  undefined1 auVar2 [16];
  ImageFloat *pIVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  iterator iVar7;
  BasicImageIO *pBVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  void *pvVar14;
  long lVar15;
  long lVar16;
  float *pfVar17;
  long lVar18;
  float *pfVar19;
  float *pfVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  ulong uVar26;
  long lVar27;
  long lVar28;
  bool bVar29;
  float fVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  float fVar33;
  float fVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  float fVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  int depth;
  long local_278;
  char *local_270;
  ImageFloat *local_268;
  long local_260;
  long local_258;
  void *local_250;
  long local_248;
  float *local_240;
  ulong local_238;
  long local_230;
  long local_228;
  ulong local_220;
  long local_218;
  long local_210;
  long local_208;
  long theight;
  long twidth;
  ImageIO *local_1f0;
  BasicImageIO *local_1e8;
  long local_1e0;
  long local_1d8;
  long tborder;
  int local_1c4;
  string tname;
  int local_198;
  Image<float,_gimage::PixelTraits<float>_> timage;
  long height;
  long width;
  string s_1;
  string suffix;
  string prefix;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  list;
  string s;
  
  local_258 = x;
  local_248 = y;
  local_1f0 = this;
  std::__cxx11::string::string((string *)&s,name,(allocator *)&timage);
  uVar6 = std::__cxx11::string::rfind((char)&s,0x3a);
  if ((uVar6 == 0xffffffffffffffff) ||
     (iVar4 = std::__cxx11::string::compare((ulong)&s,uVar6,(char *)0x2), iVar4 == 0)) {
    pBVar8 = getBasicImageIO(local_1f0,name,true);
    (*pBVar8->_vptr_BasicImageIO[8])(pBVar8,image,name,(ulong)(uint)ds,local_258,local_248,w,h);
  }
  else {
    local_1e8 = getBasicImageIO(local_1f0,name,true);
    std::__cxx11::string::string((string *)&s_1,name,(allocator *)&timage);
    uVar6 = std::__cxx11::string::rfind((char)&s_1,0x3a);
    if (uVar6 != 0xffffffffffffffff) {
      std::__cxx11::string::compare((ulong)&s_1,uVar6,(char *)0x2);
    }
    std::__cxx11::string::substr((ulong)&prefix,(ulong)&s_1);
    std::__cxx11::string::substr((ulong)&suffix,(ulong)&s_1);
    list._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &list._M_t._M_impl.super__Rb_tree_header._M_header;
    list._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    list._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    list._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    list._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         list._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    anon_unknown_17::loadTiledHeader
              (local_1e8,&list,&prefix,&suffix,&twidth,&theight,&tborder,&width,&height,&depth);
    local_278 = w;
    if (w < 1) {
      local_278 = (width + ds + -1) / (long)ds;
    }
    local_260 = h;
    if (h < 1) {
      local_260 = (height + ds + -1) / (long)ds;
    }
    lVar27 = twidth + tborder * -2;
    lVar18 = theight + tborder * -2;
    local_270 = name;
    local_268 = image;
    if (tborder == 0 && ds == 1) {
      local_230 = 0;
      if (0 < local_258) {
        local_230 = local_258;
      }
      local_230 = local_230 / lVar27;
      lVar16 = 0;
      if (0 < local_248) {
        lVar16 = local_248;
      }
      local_210 = (local_278 + local_258 + -1) / lVar27;
      local_238 = (local_260 + local_248 + -1) / lVar18;
      Image<float,_gimage::PixelTraits<float>_>::setSize(image,local_278,local_260,(long)depth);
      auVar2 = _DAT_0014f180;
      lVar15 = image->n;
      if (lVar15 != 0) {
        lVar28 = -lVar15;
        if (0 < lVar15) {
          lVar28 = lVar15;
        }
        pfVar20 = image->pixel;
        lVar15 = lVar28 + -1;
        auVar31._8_4_ = (int)lVar15;
        auVar31._0_8_ = lVar15;
        auVar31._12_4_ = (int)((ulong)lVar15 >> 0x20);
        uVar6 = 0;
        auVar31 = auVar31 ^ _DAT_0014f180;
        auVar39 = _DAT_0014f160;
        auVar35 = _DAT_0014f170;
        do {
          auVar38 = auVar35 ^ auVar2;
          iVar4 = auVar31._4_4_;
          if ((bool)(~(auVar38._4_4_ == iVar4 && auVar31._0_4_ < auVar38._0_4_ ||
                      iVar4 < auVar38._4_4_) & 1)) {
            pfVar20[uVar6] = INFINITY;
          }
          if ((auVar38._12_4_ != auVar31._12_4_ || auVar38._8_4_ <= auVar31._8_4_) &&
              auVar38._12_4_ <= auVar31._12_4_) {
            pfVar20[uVar6 + 1] = INFINITY;
          }
          auVar38 = auVar39 ^ auVar2;
          iVar5 = auVar38._4_4_;
          if (iVar5 <= iVar4 && (iVar5 != iVar4 || auVar38._0_4_ <= auVar31._0_4_)) {
            pfVar20[uVar6 + 2] = INFINITY;
            pfVar20[uVar6 + 3] = INFINITY;
          }
          uVar6 = uVar6 + 4;
          lVar15 = auVar35._8_8_;
          auVar35._0_8_ = auVar35._0_8_ + 4;
          auVar35._8_8_ = lVar15 + 4;
          lVar15 = auVar39._8_8_;
          auVar39._0_8_ = auVar39._0_8_ + 4;
          auVar39._8_8_ = lVar15 + 4;
        } while ((lVar28 + 3U & 0xfffffffffffffffc) != uVar6);
      }
      iVar4 = (int)(lVar16 / lVar18);
      if (iVar4 <= (int)local_238) {
        local_278 = local_278 + local_258;
        local_260 = local_260 + local_248;
        local_240 = (float *)(long)(int)local_230;
        local_250 = (void *)CONCAT44(local_250._4_4_,(int)local_210 + 1);
        local_228 = (long)iVar4;
        local_238 = (ulong)((int)local_238 + 1);
        do {
          if ((int)local_230 <= (int)local_210) {
            local_208 = local_248 - local_228 * lVar18;
            if (local_208 < 1) {
              local_208 = 0;
            }
            lVar16 = local_228 * lVar18 + local_208;
            local_1d8 = local_260 - lVar16;
            lVar16 = lVar16 - local_248;
            pfVar20 = local_240;
            do {
              lVar15 = local_258 - (long)pfVar20 * lVar27;
              if (lVar15 < 1) {
                lVar15 = 0;
              }
              lVar23 = (long)pfVar20 * lVar27 + lVar15;
              lVar28 = local_278 - lVar23;
              if (twidth - lVar15 <= lVar28) {
                lVar28 = twidth - lVar15;
              }
              lVar9 = theight - local_208;
              if (local_1d8 < theight - local_208) {
                lVar9 = local_1d8;
              }
              anon_unknown_17::getTileName(&tname,&prefix,(int)local_228,(int)pfVar20,&suffix);
              timage.depth = 0;
              timage.row = (float **)0x0;
              timage.img = (float ***)0x0;
              timage.n = 0;
              timage.pixel = (float *)0x0;
              timage.width = 0;
              timage.height = 0;
              Image<float,_gimage::PixelTraits<float>_>::setSize(&timage,lVar28,lVar9,(long)depth);
              iVar7 = std::
                      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::find(&list._M_t,&tname);
              if ((_Rb_tree_header *)iVar7._M_node != &list._M_t._M_impl.super__Rb_tree_header) {
                (*local_1e8->_vptr_BasicImageIO[8])
                          (local_1e8,&timage,tname._M_dataplus._M_p,1,lVar15,local_208,lVar28,lVar9)
                ;
                if (0 < timage.height) {
                  lVar15 = 0;
                  do {
                    if (0 < timage.width) {
                      pppfVar1 = local_268->img;
                      lVar28 = 0;
                      do {
                        if (0 < depth) {
                          uVar6 = 0;
                          do {
                            pppfVar1[uVar6][lVar16 + lVar15][(lVar23 - local_258) + lVar28] =
                                 timage.img[uVar6][lVar15][lVar28];
                            uVar6 = uVar6 + 1;
                          } while ((uint)depth != uVar6);
                        }
                        lVar28 = lVar28 + 1;
                      } while (lVar28 != timage.width);
                    }
                    lVar15 = lVar15 + 1;
                  } while (lVar15 != timage.height);
                }
              }
              Image<float,_gimage::PixelTraits<float>_>::~Image(&timage);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)tname._M_dataplus._M_p != &tname.field_2) {
                operator_delete(tname._M_dataplus._M_p);
              }
              pfVar20 = (float *)((long)pfVar20 + 1);
            } while ((int)local_250 != (int)pfVar20);
          }
          local_228 = local_228 + 1;
        } while ((int)local_238 != (int)local_228);
      }
    }
    else {
      local_238 = (ulong)ds;
      lVar15 = local_238 * local_258;
      lVar16 = lVar15 - tborder;
      if (lVar15 - tborder < 1) {
        lVar16 = 0;
      }
      lVar23 = local_238 * local_248;
      lVar28 = lVar23 - tborder;
      if (lVar23 - tborder < 1) {
        lVar28 = 0;
      }
      lVar9 = (local_258 + local_278 + -1) * local_238 + tborder;
      local_220 = (long)((local_260 + local_248 + -1) * local_238 + tborder) / lVar18;
      lVar24 = (long)depth;
      lVar22 = local_278 * local_260;
      uVar6 = lVar22 * 4;
      local_240 = (float *)operator_new(lVar24 * uVar6);
      memset(local_240,0,lVar24 * uVar6);
      local_250 = operator_new(uVar6);
      memset(local_250,0,uVar6);
      iVar4 = (int)(lVar28 / lVar18);
      if (iVar4 <= (int)local_220) {
        lVar24 = (local_278 + local_258) * local_238;
        lVar28 = (local_260 + local_248) * local_238;
        local_198 = (int)(lVar16 / lVar27);
        iVar5 = (int)(lVar9 / lVar27);
        local_1c4 = iVar5 + 1;
        local_218 = (long)iVar4;
        local_220 = (ulong)((int)local_220 + 1);
        lVar16 = local_278 * 4;
        do {
          if (local_198 <= iVar5) {
            lVar10 = local_218 * lVar18;
            lVar9 = (long)local_198;
            do {
              lVar25 = tborder - lVar9 * lVar27;
              local_230 = lVar25 + lVar15;
              if (local_230 < 1) {
                local_230 = 0;
              }
              lVar21 = tborder - lVar10;
              local_1e0 = lVar21 + lVar23;
              if (local_1e0 < 1) {
                local_1e0 = 0;
              }
              lVar25 = (lVar25 + lVar24) - local_230;
              if (twidth - local_230 <= lVar25) {
                lVar25 = twidth - local_230;
              }
              lVar21 = (lVar21 + lVar28) - local_1e0;
              if (theight - local_1e0 <= lVar21) {
                lVar21 = theight - local_1e0;
              }
              anon_unknown_17::getTileName(&tname,&prefix,(int)local_218,(int)lVar9,&suffix);
              timage.depth = 0;
              timage._40_16_ = ZEXT816(0);
              timage._24_16_ = ZEXT816(0);
              timage._8_16_ = ZEXT816(0);
              Image<float,_gimage::PixelTraits<float>_>::setSize(&timage,lVar25,lVar21,(long)depth);
              iVar7 = std::
                      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::find(&list._M_t,&tname);
              if ((_Rb_tree_header *)iVar7._M_node != &list._M_t._M_impl.super__Rb_tree_header) {
                (*local_1e8->_vptr_BasicImageIO[8])
                          (local_1e8,&timage,tname._M_dataplus._M_p,1,local_230,local_1e0,lVar25,
                           lVar21);
                if (0 < timage.height) {
                  uVar6 = (ulong)(uint)timage.depth;
                  fVar30 = (float)tborder + (float)tborder;
                  local_210 = twidth;
                  local_1d8 = tborder;
                  local_228 = (lVar9 * lVar27 + local_230) - (lVar15 + tborder);
                  lVar25 = 0;
                  do {
                    if (0 < timage.width) {
                      local_208 = ((local_1e0 + lVar10) - (lVar23 + tborder)) + lVar25;
                      fVar34 = (float)(local_1e0 + lVar25) / fVar30;
                      fVar33 = (float)(theight - (local_1e0 + lVar25)) / fVar30;
                      if (fVar34 <= fVar33) {
                        fVar33 = fVar34;
                      }
                      if (1.0 <= fVar33) {
                        fVar33 = 1.0;
                      }
                      if (fVar33 <= 1e-06) {
                        fVar33 = 1e-06;
                      }
                      lVar21 = 0;
                      do {
                        bVar29 = timage.depth < 1;
                        if (timage.depth < 1) {
LAB_00134bdb:
                          if (bVar29) {
                            lVar12 = (local_228 + lVar21) / (long)local_238;
                            lVar13 = local_208 / (long)local_238;
                            if (tborder < 1) {
                              if (0 < depth) {
                                pfVar20 = (float *)(lVar16 * lVar13 + lVar12 * 4 + (long)local_240);
                                uVar26 = 0;
                                do {
                                  *pfVar20 = timage.img[uVar26][lVar25][lVar21] + *pfVar20;
                                  uVar26 = uVar26 + 1;
                                  pfVar20 = pfVar20 + lVar22;
                                } while ((uint)depth != uVar26);
                              }
                              pvVar14 = (void *)((long)local_250 + lVar13 * local_278 * 4);
                              fVar34 = *(float *)((long)pvVar14 + lVar12 * 4) + 1.0;
                            }
                            else {
                              fVar37 = (float)(lVar21 + local_230) / fVar30;
                              fVar34 = (float)(twidth - (lVar21 + local_230)) / fVar30;
                              if (fVar37 <= fVar34) {
                                fVar34 = fVar37;
                              }
                              if (1.0 <= fVar34) {
                                fVar34 = 1.0;
                              }
                              if (fVar34 <= 1e-06) {
                                fVar34 = 1e-06;
                              }
                              if (0 < depth) {
                                pfVar20 = (float *)(lVar16 * lVar13 + lVar12 * 4 + (long)local_240);
                                uVar26 = 0;
                                do {
                                  *pfVar20 = timage.img[uVar26][lVar25][lVar21] * fVar34 * fVar33 +
                                             *pfVar20;
                                  uVar26 = uVar26 + 1;
                                  pfVar20 = pfVar20 + lVar22;
                                } while ((uint)depth != uVar26);
                              }
                              pvVar14 = (void *)((long)local_250 + lVar13 * local_278 * 4);
                              fVar34 = fVar34 * fVar33 + *(float *)((long)pvVar14 + lVar12 * 4);
                            }
                            *(float *)((long)pvVar14 + lVar12 * 4) = fVar34;
                          }
                        }
                        else if ((uint)ABS((*timage.img)[lVar25][lVar21]) < 0x7f800000) {
                          uVar26 = 0;
                          do {
                            uVar11 = uVar6;
                            if (uVar6 - 1 == uVar26) break;
                            lVar12 = uVar26 + 1;
                            uVar11 = uVar26 + 1;
                            uVar26 = uVar11;
                          } while ((uint)ABS(timage.img[lVar12][lVar25][lVar21]) < 0x7f800000);
                          bVar29 = uVar6 <= uVar11;
                          goto LAB_00134bdb;
                        }
                        lVar21 = lVar21 + 1;
                      } while (lVar21 != timage.width);
                    }
                    lVar25 = lVar25 + 1;
                  } while (lVar25 != timage.height);
                }
              }
              Image<float,_gimage::PixelTraits<float>_>::~Image(&timage);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)tname._M_dataplus._M_p != &tname.field_2) {
                operator_delete(tname._M_dataplus._M_p);
              }
              lVar9 = lVar9 + 1;
            } while (local_1c4 != (int)lVar9);
          }
          local_218 = local_218 + 1;
        } while ((int)local_220 != (int)local_218);
      }
      lVar27 = local_260;
      pIVar3 = local_268;
      Image<float,_gimage::PixelTraits<float>_>::setSize(local_268,local_278,local_260,(long)depth);
      auVar2 = _DAT_0014f180;
      lVar18 = pIVar3->n;
      if (lVar18 != 0) {
        lVar16 = -lVar18;
        if (0 < lVar18) {
          lVar16 = lVar18;
        }
        pfVar20 = pIVar3->pixel;
        lVar18 = lVar16 + -1;
        auVar32._8_4_ = (int)lVar18;
        auVar32._0_8_ = lVar18;
        auVar32._12_4_ = (int)((ulong)lVar18 >> 0x20);
        uVar6 = 0;
        auVar32 = auVar32 ^ _DAT_0014f180;
        auVar38 = _DAT_0014f160;
        auVar36 = _DAT_0014f170;
        do {
          auVar39 = auVar36 ^ auVar2;
          iVar4 = auVar32._4_4_;
          if ((bool)(~(auVar39._4_4_ == iVar4 && auVar32._0_4_ < auVar39._0_4_ ||
                      iVar4 < auVar39._4_4_) & 1)) {
            pfVar20[uVar6] = INFINITY;
          }
          if ((auVar39._12_4_ != auVar32._12_4_ || auVar39._8_4_ <= auVar32._8_4_) &&
              auVar39._12_4_ <= auVar32._12_4_) {
            pfVar20[uVar6 + 1] = INFINITY;
          }
          auVar39 = auVar38 ^ auVar2;
          iVar5 = auVar39._4_4_;
          if (iVar5 <= iVar4 && (iVar5 != iVar4 || auVar39._0_4_ <= auVar32._0_4_)) {
            pfVar20[uVar6 + 2] = INFINITY;
            pfVar20[uVar6 + 3] = INFINITY;
          }
          uVar6 = uVar6 + 4;
          lVar18 = auVar36._8_8_;
          auVar36._0_8_ = auVar36._0_8_ + 4;
          auVar36._8_8_ = lVar18 + 4;
          lVar18 = auVar38._8_8_;
          auVar38._0_8_ = auVar38._0_8_ + 4;
          auVar38._8_8_ = lVar18 + 4;
        } while ((lVar16 + 3U & 0xfffffffffffffffc) != uVar6);
      }
      if (0 < lVar27) {
        lVar18 = 0;
        pfVar20 = local_240;
        do {
          if (0 < local_278) {
            pppfVar1 = pIVar3->img;
            lVar16 = 0;
            pfVar17 = pfVar20;
            do {
              fVar30 = *(float *)((long)local_250 + lVar16 * 4 + lVar18 * local_278 * 4);
              if ((0.0 < fVar30) && (0 < depth)) {
                uVar6 = 0;
                pfVar19 = pfVar17;
                do {
                  pppfVar1[uVar6][lVar18][lVar16] = *pfVar19 / fVar30;
                  uVar6 = uVar6 + 1;
                  pfVar19 = pfVar19 + lVar22;
                } while ((uint)depth != uVar6);
              }
              lVar16 = lVar16 + 1;
              pfVar17 = pfVar17 + 1;
            } while (lVar16 != local_278);
          }
          lVar18 = lVar18 + 1;
          pfVar20 = pfVar20 + local_278;
        } while (lVar18 != lVar27);
      }
      operator_delete(local_250);
      operator_delete(local_240);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&list._M_t);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)suffix._M_dataplus._M_p != &suffix.field_2) {
      operator_delete(suffix._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)prefix._M_dataplus._M_p != &prefix.field_2) {
      operator_delete(prefix._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)s_1._M_dataplus._M_p != &s_1.field_2) {
      operator_delete(s_1._M_dataplus._M_p);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)s._M_dataplus._M_p != &s.field_2) {
    operator_delete(s._M_dataplus._M_p);
  }
  return;
}

Assistant:

void ImageIO::load(ImageFloat &image, const char *name, int ds, long x, long y,
                   long w, long h) const
{
  std::string s=name;
  size_t pos=s.rfind(':');

  if (pos != s.npos && s.compare(pos, 2, ":\\") == 0)
  {
    pos=s.npos;
  }

  if (pos == s.npos)
  {
    getBasicImageIO(name, true).load(image, name, ds, x, y, w, h);
  }
  else
  {
    try
    {
      loadTiled(getBasicImageIO(name, true), image, name, ds, x, y, w, h);
    }
    catch (const std::exception &)
    {
      // if loading as tiled image fails, try loading as image with colon in file name
      getBasicImageIO(name, true).load(image, name, ds, x, y, w, h);
    }
  }
}